

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
IndexTools::JointToIndividualIndicesStepSize
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Index jointI,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *step_size,size_t vec_size)

{
  long lVar1;
  size_t sVar2;
  const_reference pvVar3;
  ulong uVar4;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined1 *local_90;
  undefined1 *local_88;
  ulong local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  undefined1 *local_68 [3];
  undefined1 local_4a;
  undefined1 local_49;
  int local_48;
  uint local_44;
  Index aI;
  Index i;
  unsigned_long __vla_expr0;
  Index local_2c;
  size_t sStack_28;
  Index remainder;
  size_t vec_size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *step_size_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_10;
  Index jointI_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  local_78 = __return_storage_ptr__;
  local_70 = __return_storage_ptr__;
  pvStack_10 = __return_storage_ptr__;
  step_size_local._4_4_ = jointI;
  vec_size_local = (size_t)step_size;
  sStack_28 = vec_size;
  local_2c = jointI;
  __vla_expr0 = (unsigned_long)auStack_98;
  lVar1 = -(vec_size * 4 + 0xf & 0xfffffffffffffff0);
  local_68[0] = auStack_98 + lVar1;
  _aI = vec_size;
  for (local_44 = 0; sVar2 = vec_size_local, local_44 < sStack_28; local_44 = local_44 + 1) {
    local_80 = (ulong)local_2c;
    uVar4 = (ulong)local_44;
    *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0c218;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar2,uVar4);
    sVar2 = vec_size_local;
    local_48 = (int)(local_80 / *pvVar3);
    *(int *)(local_68[0] + (ulong)local_44 * 4) = local_48;
    uVar4 = (ulong)local_44;
    *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0c245;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar2,uVar4);
    local_2c = local_2c - (int)*pvVar3 * local_48;
  }
  local_49 = 0;
  local_90 = local_68[0] + sStack_28 * 4;
  local_88 = &local_4a;
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0c287;
  std::allocator<unsigned_int>::allocator(*(allocator<unsigned_int> **)((long)&uStack_a0 + lVar1));
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0c29f;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              (&stack0xffffffffffffffb0 + lVar1),*(uint **)((long)local_68 + lVar1 + 0x10),
             *(uint **)((long)local_68 + lVar1 + 8),*(allocator_type **)((long)local_68 + lVar1));
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0c2aa;
  std::allocator<unsigned_int>::~allocator(*(allocator<unsigned_int> **)((long)&uStack_a0 + lVar1));
  local_49 = 1;
  return local_70;
}

Assistant:

vector<Index> IndexTools::JointToIndividualIndicesStepSize(
        Index jointI, 
        const vector<size_t> &step_size, 
        size_t vec_size  
    )
{
    Index remainder = jointI;

    Index resultArr[vec_size];
    for(Index i=0; i < vec_size ; i++)
    {
        Index aI = remainder / step_size[i];
        resultArr[i] = aI;//store this indiv. index
        //remainder = remainder %  step_size[i];
        remainder -= step_size[i] * aI;
    }
    vector<Index> result(&resultArr[0], &resultArr[vec_size]);
    return(result);
}